

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::LSTMWeightParams::ByteSizeLong(LSTMWeightParams *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->inputgateweightmatrix_ == (WeightParams *)0x0 ||
      this == (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->inputgateweightmatrix_);
    sVar1 = sVar1 + 1;
  }
  if (this->forgetgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->forgetgateweightmatrix_)
    ;
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->blockinputweightmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->blockinputweightmatrix_)
    ;
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->outputgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->outputgateweightmatrix_)
    ;
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->inputgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->inputgaterecursionmatrix_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->forgetgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->forgetgaterecursionmatrix_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->blockinputrecursionmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->blockinputrecursionmatrix_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->outputgaterecursionmatrix_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->inputgatebiasvector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->inputgatebiasvector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->forgetgatebiasvector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->forgetgatebiasvector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->blockinputbiasvector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->blockinputbiasvector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->outputgatebiasvector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->outputgatebiasvector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->inputgatepeepholevector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->inputgatepeepholevector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->forgetgatepeepholevector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->forgetgatepeepholevector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->outputgatepeepholevector_ != (WeightParams *)0x0 &&
      this != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->outputgatepeepholevector_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t LSTMWeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LSTMWeightParams)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams inputGateWeightMatrix = 1;
  if (this->has_inputgateweightmatrix()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->inputgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams forgetGateWeightMatrix = 2;
  if (this->has_forgetgateweightmatrix()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->forgetgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams blockInputWeightMatrix = 3;
  if (this->has_blockinputweightmatrix()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->blockinputweightmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 4;
  if (this->has_outputgateweightmatrix()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams inputGateRecursionMatrix = 20;
  if (this->has_inputgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->inputgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams forgetGateRecursionMatrix = 21;
  if (this->has_forgetgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->forgetgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams blockInputRecursionMatrix = 22;
  if (this->has_blockinputrecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->blockinputrecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 23;
  if (this->has_outputgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams inputGateBiasVector = 40;
  if (this->has_inputgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->inputgatebiasvector_);
  }

  // .CoreML.Specification.WeightParams forgetGateBiasVector = 41;
  if (this->has_forgetgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->forgetgatebiasvector_);
  }

  // .CoreML.Specification.WeightParams blockInputBiasVector = 42;
  if (this->has_blockinputbiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->blockinputbiasvector_);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 43;
  if (this->has_outputgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgatebiasvector_);
  }

  // .CoreML.Specification.WeightParams inputGatePeepholeVector = 60;
  if (this->has_inputgatepeepholevector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->inputgatepeepholevector_);
  }

  // .CoreML.Specification.WeightParams forgetGatePeepholeVector = 61;
  if (this->has_forgetgatepeepholevector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->forgetgatepeepholevector_);
  }

  // .CoreML.Specification.WeightParams outputGatePeepholeVector = 62;
  if (this->has_outputgatepeepholevector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgatepeepholevector_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}